

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XercesXPath.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::XPathScannerForSchema::addToken
          (XPathScannerForSchema *this,ValueVectorOf<int> *tokens,int aToken)

{
  XMLSize_t XVar1;
  XPathException *this_00;
  
  if (((uint)aToken < 0x25) && ((0x1800e00f50U >> ((ulong)(uint)aToken & 0x3f) & 1) != 0)) {
    ValueVectorOf<int>::ensureExtraCapacity(tokens,1);
    XVar1 = tokens->fCurCount;
    tokens->fCurCount = XVar1 + 1;
    tokens->fElemList[XVar1] = aToken;
    return;
  }
  this_00 = (XPathException *)__cxa_allocate_exception(0x30);
  XPathException::XPathException
            (this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/identity/XercesXPath.cpp"
             ,0x5ad,XPath_TokenNotSupported,tokens->fMemoryManager);
  __cxa_throw(this_00,&XPathException::typeinfo,XMLException::~XMLException);
}

Assistant:

void XPathScannerForSchema::addToken(ValueVectorOf<int>* const tokens,
                                     const int aToken) {

    if (aToken == XercesXPath::EXPRTOKEN_ATSIGN ||
        aToken == XercesXPath::EXPRTOKEN_AXISNAME_ATTRIBUTE ||
        aToken == XercesXPath::EXPRTOKEN_AXISNAME_CHILD ||
        //token == XercesXPath::EXPRTOKEN_AXISNAME_SELF ||
        aToken == XercesXPath::EXPRTOKEN_DOUBLE_COLON ||
        aToken == XercesXPath::EXPRTOKEN_NAMETEST_QNAME ||
        //token == XercesXPath::EXPRTOKEN_NODETYPE_NODE ||
        aToken == XercesXPath::EXPRTOKEN_OPERATOR_SLASH ||
        aToken == XercesXPath::EXPRTOKEN_PERIOD ||
        aToken == XercesXPath::EXPRTOKEN_NAMETEST_ANY ||
        aToken == XercesXPath::EXPRTOKEN_NAMETEST_NAMESPACE ||
        aToken == XercesXPath::EXPRTOKEN_OPERATOR_DOUBLE_SLASH ||
        aToken == XercesXPath::EXPRTOKEN_OPERATOR_UNION) {

        tokens->addElement(aToken);
        return;
    }

    ThrowXMLwithMemMgr(XPathException, XMLExcepts::XPath_TokenNotSupported, tokens->getMemoryManager());
}